

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O1

bool __thiscall
cmQtAutoGenerators::InitializeAutogenTarget(cmQtAutoGenerators *this,cmTarget *target)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  cmSourceFile *this_01;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  string *psVar6;
  size_t sVar7;
  long *plVar8;
  cmGlobalGenerator *pcVar9;
  cmTarget *this_02;
  cmState *pcVar10;
  size_type *psVar11;
  pointer ppcVar12;
  cmQtAutoGenerators *this_03;
  _Alloc_hider _Var13;
  string tools;
  string absFile;
  string autogenTargetName;
  string workingDirectory;
  string autogenComment;
  string local_248;
  string targetDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toolNames;
  string basename;
  cmCustomCommandLine currentLine;
  string rcc_output_file;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> srcFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string rcc_output_dir;
  string ext;
  string qtMajorVersion;
  string local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rcc_output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  cmCustomCommandLines commandLines;
  string local_70;
  string local_50;
  
  this_00 = target->Makefile;
  autogenTargetName._M_dataplus._M_p = (pointer)&autogenTargetName.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&autogenTargetName,"QT_VERSION_MAJOR","");
  pcVar5 = cmMakefile::GetSafeDefinition(this_00,&autogenTargetName);
  std::__cxx11::string::string((string *)&qtMajorVersion,pcVar5,(allocator *)&targetDir);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)autogenTargetName._M_dataplus._M_p != &autogenTargetName.field_2) {
    operator_delete(autogenTargetName._M_dataplus._M_p,
                    autogenTargetName.field_2._M_allocated_capacity + 1);
  }
  iVar4 = std::__cxx11::string::compare((char *)&qtMajorVersion);
  if (iVar4 == 0) {
    autogenTargetName._M_dataplus._M_p = (pointer)&autogenTargetName.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&autogenTargetName,"Qt5Core_VERSION_MAJOR","");
    pcVar5 = cmMakefile::GetSafeDefinition(this_00,&autogenTargetName);
    strlen(pcVar5);
    std::__cxx11::string::_M_replace
              ((ulong)&qtMajorVersion,0,(char *)qtMajorVersion._M_string_length,(ulong)pcVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)autogenTargetName._M_dataplus._M_p != &autogenTargetName.field_2) {
      operator_delete(autogenTargetName._M_dataplus._M_p,
                      autogenTargetName.field_2._M_allocated_capacity + 1);
    }
  }
  iVar4 = std::__cxx11::string::compare((char *)&qtMajorVersion);
  if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)&qtMajorVersion), iVar4 == 0))
  {
    autogenTargetName._M_dataplus._M_p = (pointer)&autogenTargetName.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&autogenTargetName,"AUTOMOC","");
    bVar3 = cmTarget::GetPropertyAsBool(target,&autogenTargetName);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)autogenTargetName._M_dataplus._M_p != &autogenTargetName.field_2) {
      operator_delete(autogenTargetName._M_dataplus._M_p,
                      autogenTargetName.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      getAutogenTargetName_abi_cxx11_(&autogenTargetName,target);
      pcVar5 = cmMakefile::GetCurrentBinaryDirectory(this_00);
      std::__cxx11::string::string((string *)&targetDir,pcVar5,(allocator *)&workingDirectory);
      std::__cxx11::string::append((char *)&targetDir);
      std::__cxx11::string::_M_append((char *)&targetDir,(ulong)autogenTargetName._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&targetDir);
      cmMakefile::GetOrCreateSource(this_00,&targetDir,true);
      workingDirectory._M_dataplus._M_p = (pointer)&workingDirectory.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&workingDirectory,"ADDITIONAL_MAKE_CLEAN_FILES","");
      cmMakefile::AppendProperty(this_00,&workingDirectory,targetDir._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)workingDirectory._M_dataplus._M_p != &workingDirectory.field_2) {
        operator_delete(workingDirectory._M_dataplus._M_p,
                        workingDirectory.field_2._M_allocated_capacity + 1);
      }
      cmTarget::AddSource(target,&targetDir);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetDir._M_dataplus._M_p != &targetDir.field_2) {
        operator_delete(targetDir._M_dataplus._M_p,targetDir.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)autogenTargetName._M_dataplus._M_p != &autogenTargetName.field_2) {
        operator_delete(autogenTargetName._M_dataplus._M_p,
                        autogenTargetName.field_2._M_allocated_capacity + 1);
      }
    }
    getAutogenTargetName_abi_cxx11_(&autogenTargetName,target);
    getAutogenTargetDir_abi_cxx11_(&targetDir,target);
    currentLine.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    currentLine.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    currentLine.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    psVar6 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&currentLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ,psVar6);
    workingDirectory._M_dataplus._M_p = (pointer)&workingDirectory.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&workingDirectory,"-E","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&currentLine,
               &workingDirectory);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)workingDirectory._M_dataplus._M_p != &workingDirectory.field_2) {
      operator_delete(workingDirectory._M_dataplus._M_p,
                      workingDirectory.field_2._M_allocated_capacity + 1);
    }
    workingDirectory._M_dataplus._M_p = (pointer)&workingDirectory.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&workingDirectory,"cmake_autogen","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&currentLine,
               &workingDirectory);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)workingDirectory._M_dataplus._M_p != &workingDirectory.field_2) {
      operator_delete(workingDirectory._M_dataplus._M_p,
                      workingDirectory.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&currentLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ,&targetDir);
    workingDirectory._M_dataplus._M_p = (pointer)&workingDirectory.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&workingDirectory,"$<CONFIGURATION>","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&currentLine,
               &workingDirectory);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)workingDirectory._M_dataplus._M_p != &workingDirectory.field_2) {
      operator_delete(workingDirectory._M_dataplus._M_p,
                      workingDirectory.field_2._M_allocated_capacity + 1);
    }
    commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
              (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
               ,&currentLine);
    tools._M_dataplus._M_p = (pointer)&tools.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&tools,"");
    pcVar5 = cmMakefile::GetCurrentBinaryDirectory(this_00);
    cmsys::SystemTools::CollapseFullPath(&workingDirectory,&tools,pcVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tools._M_dataplus._M_p != &tools.field_2) {
      operator_delete(tools._M_dataplus._M_p,tools.field_2._M_allocated_capacity + 1);
    }
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tools._M_dataplus._M_p = (pointer)&tools.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&tools,"AUTOGEN_TARGET_DEPENDS","");
    pcVar5 = cmTarget::GetProperty(target,&tools);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tools._M_dataplus._M_p != &tools.field_2) {
      operator_delete(tools._M_dataplus._M_p,tools.field_2._M_allocated_capacity + 1);
    }
    if (pcVar5 != (char *)0x0) {
      tools._M_dataplus._M_p = (pointer)&tools.field_2;
      sVar7 = strlen(pcVar5);
      std::__cxx11::string::_M_construct<char_const*>((string *)&tools,pcVar5,pcVar5 + sVar7);
      cmSystemTools::ExpandListArgument(&tools,&depends,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tools._M_dataplus._M_p != &tools.field_2) {
        operator_delete(tools._M_dataplus._M_p,tools.field_2._M_allocated_capacity + 1);
      }
    }
    toolNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    toolNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    toolNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tools._M_dataplus._M_p = (pointer)&tools.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&tools,"AUTOMOC","");
    bVar3 = cmTarget::GetPropertyAsBool(target,&tools);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tools._M_dataplus._M_p != &tools.field_2) {
      operator_delete(tools._M_dataplus._M_p,tools.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      tools._M_dataplus._M_p = (pointer)&tools.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&tools,"moc","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&toolNames,
                 &tools);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tools._M_dataplus._M_p != &tools.field_2) {
        operator_delete(tools._M_dataplus._M_p,tools.field_2._M_allocated_capacity + 1);
      }
    }
    tools._M_dataplus._M_p = (pointer)&tools.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&tools,"AUTOUIC","");
    bVar3 = cmTarget::GetPropertyAsBool(target,&tools);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tools._M_dataplus._M_p != &tools.field_2) {
      operator_delete(tools._M_dataplus._M_p,tools.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      tools._M_dataplus._M_p = (pointer)&tools.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&tools,"uic","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&toolNames,
                 &tools);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tools._M_dataplus._M_p != &tools.field_2) {
        operator_delete(tools._M_dataplus._M_p,tools.field_2._M_allocated_capacity + 1);
      }
    }
    tools._M_dataplus._M_p = (pointer)&tools.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&tools,"AUTORCC","");
    bVar3 = cmTarget::GetPropertyAsBool(target,&tools);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tools._M_dataplus._M_p != &tools.field_2) {
      operator_delete(tools._M_dataplus._M_p,tools.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      tools._M_dataplus._M_p = (pointer)&tools.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&tools,"rcc","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&toolNames,
                 &tools);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tools._M_dataplus._M_p != &tools.field_2) {
        operator_delete(tools._M_dataplus._M_p,tools.field_2._M_allocated_capacity + 1);
      }
    }
    tools._M_dataplus._M_p = (pointer)&tools.field_2;
    pcVar2 = ((toolNames.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&tools,pcVar2,
               pcVar2 + (toolNames.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&toolNames,
               (iterator)
               toolNames.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    paVar1 = &autogenComment.field_2;
    while (0x20 < (ulong)((long)toolNames.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)toolNames.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)) {
      std::operator+(&autogenComment,", ",
                     toolNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      std::__cxx11::string::_M_append((char *)&tools,(ulong)autogenComment._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)autogenComment._M_dataplus._M_p != paVar1) {
        operator_delete(autogenComment._M_dataplus._M_p,
                        autogenComment.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(&toolNames,
                 (iterator)
                 toolNames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((long)toolNames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)toolNames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x20) {
      std::operator+(&autogenComment," and ",
                     toolNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      std::__cxx11::string::_M_append((char *)&tools,(ulong)autogenComment._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)autogenComment._M_dataplus._M_p != paVar1) {
        operator_delete(autogenComment._M_dataplus._M_p,
                        autogenComment.field_2._M_allocated_capacity + 1);
      }
    }
    std::operator+(&absFile,"Automatic ",&tools);
    plVar8 = (long *)std::__cxx11::string::append((char *)&absFile);
    psVar11 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar11) {
      autogenComment.field_2._M_allocated_capacity = *psVar11;
      autogenComment.field_2._8_8_ = plVar8[3];
      autogenComment._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      autogenComment.field_2._M_allocated_capacity = *psVar11;
      autogenComment._M_dataplus._M_p = (pointer)*plVar8;
    }
    autogenComment._M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)absFile._M_dataplus._M_p != &absFile.field_2) {
      operator_delete(absFile._M_dataplus._M_p,absFile.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_append((char *)&autogenComment,(ulong)(target->Name)._M_dataplus._M_p);
    rcc_output.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    rcc_output.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    rcc_output.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar9 = cmMakefile::GetGlobalGenerator(this_00);
    (*pcVar9->_vptr_cmGlobalGenerator[2])(&absFile,pcVar9);
    iVar4 = std::__cxx11::string::compare((char *)&absFile);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)absFile._M_dataplus._M_p != &absFile.field_2) {
      operator_delete(absFile._M_dataplus._M_p,absFile.field_2._M_allocated_capacity + 1);
    }
    if (iVar4 == 0) {
      srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmTarget::GetConfigCommonSourceFiles(target,&srcFiles);
      if (srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        ppcVar12 = srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        do {
          this_01 = *ppcVar12;
          psVar6 = cmSourceFile::GetFullPath(this_01,(string *)0x0);
          cmsys::SystemTools::GetRealPath(&absFile,psVar6,(string *)0x0);
          psVar6 = cmSourceFile::GetExtension_abi_cxx11_(this_01);
          ext._M_dataplus._M_p = (pointer)&ext.field_2;
          pcVar2 = (psVar6->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&ext,pcVar2,pcVar2 + psVar6->_M_string_length);
          basename._M_dataplus._M_p = (pointer)&basename.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&basename,"AUTORCC","");
          bVar3 = cmTarget::GetPropertyAsBool(target,&basename);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)basename._M_dataplus._M_p != &basename.field_2) {
            operator_delete(basename._M_dataplus._M_p,basename.field_2._M_allocated_capacity + 1);
          }
          if (bVar3) {
            iVar4 = std::__cxx11::string::compare((char *)&ext);
            if (iVar4 == 0) {
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"SKIP_AUTORCC","")
              ;
              pcVar5 = cmSourceFile::GetPropertyForUser(this_01,&local_e8);
              bVar3 = cmSystemTools::IsOn(pcVar5);
              bVar3 = !bVar3;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1
                               );
              }
            }
            else {
              bVar3 = false;
            }
            if (bVar3) {
              cmsys::SystemTools::GetFilenameWithoutLastExtension(&basename,&absFile);
              cmTarget::GetSupportDirectory_abi_cxx11_(&rcc_output_dir,target);
              cmsys::SystemTools::MakeDirectory(rcc_output_dir._M_dataplus._M_p);
              rcc_output_file._M_dataplus._M_p = (pointer)&rcc_output_file.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&rcc_output_file,rcc_output_dir._M_dataplus._M_p,
                         rcc_output_dir._M_dataplus._M_p + rcc_output_dir._M_string_length);
              std::operator+(&local_a8,"/qrc_",&basename);
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_a8);
              local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
              psVar11 = (size_type *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar11) {
                local_248.field_2._M_allocated_capacity = *psVar11;
                local_248.field_2._8_8_ = plVar8[3];
              }
              else {
                local_248.field_2._M_allocated_capacity = *psVar11;
                local_248._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_248._M_string_length = plVar8[1];
              *plVar8 = (long)psVar11;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              std::__cxx11::string::_M_append
                        ((char *)&rcc_output_file,(ulong)local_248._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != &local_248.field_2) {
                operator_delete(local_248._M_dataplus._M_p,
                                local_248.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1
                               );
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&rcc_output,&rcc_output_file);
              local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"GENERATED","");
              pcVar5 = cmSourceFile::GetPropertyForUser(this_01,&local_248);
              bVar3 = cmSystemTools::IsOn(pcVar5);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != &local_248.field_2) {
                operator_delete(local_248._M_dataplus._M_p,
                                local_248.field_2._M_allocated_capacity + 1);
              }
              if (!bVar3) {
                this_03 = (cmQtAutoGenerators *)0x4ece2a;
                iVar4 = std::__cxx11::string::compare((char *)&qtMajorVersion);
                if (iVar4 == 0) {
                  ListQt5RccInputs(&local_50,this,this_01,target,&depends);
                  psVar6 = &local_50;
                  _Var13._M_p = local_50._M_dataplus._M_p;
                }
                else {
                  ListQt4RccInputs(&local_70,this_03,this_01,&depends);
                  psVar6 = &local_70;
                  _Var13._M_p = local_70._M_dataplus._M_p;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var13._M_p != &psVar6->field_2) {
                  operator_delete(_Var13._M_p,(psVar6->field_2)._M_allocated_capacity + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)rcc_output_file._M_dataplus._M_p != &rcc_output_file.field_2) {
                operator_delete(rcc_output_file._M_dataplus._M_p,
                                rcc_output_file.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)rcc_output_dir._M_dataplus._M_p != &rcc_output_dir.field_2) {
                operator_delete(rcc_output_dir._M_dataplus._M_p,
                                rcc_output_dir.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)basename._M_dataplus._M_p != &basename.field_2) {
                operator_delete(basename._M_dataplus._M_p,basename.field_2._M_allocated_capacity + 1
                               );
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)ext._M_dataplus._M_p != &ext.field_2) {
            operator_delete(ext._M_dataplus._M_p,ext.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)absFile._M_dataplus._M_p != &absFile.field_2) {
            operator_delete(absFile._M_dataplus._M_p,absFile.field_2._M_allocated_capacity + 1);
          }
          ppcVar12 = ppcVar12 + 1;
        } while (ppcVar12 !=
                 srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      if (srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)srcFiles.
                              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)srcFiles.
                              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    this_02 = cmMakefile::AddUtilityCommand
                        (this_00,&autogenTargetName,true,workingDirectory._M_dataplus._M_p,
                         &rcc_output,&depends,&commandLines,false,autogenComment._M_dataplus._M_p,
                         false);
    pcVar10 = cmMakefile::GetState(this_00);
    absFile._M_dataplus._M_p = (pointer)&absFile.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&absFile,"AUTOMOC_TARGETS_FOLDER","");
    pcVar5 = cmState::GetGlobalProperty(pcVar10,&absFile);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)absFile._M_dataplus._M_p != &absFile.field_2) {
      operator_delete(absFile._M_dataplus._M_p,absFile.field_2._M_allocated_capacity + 1);
    }
    if (pcVar5 == (char *)0x0) {
      pcVar10 = cmMakefile::GetState(this_00);
      absFile._M_dataplus._M_p = (pointer)&absFile.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&absFile,"AUTOGEN_TARGETS_FOLDER","");
      pcVar5 = cmState::GetGlobalProperty(pcVar10,&absFile);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)absFile._M_dataplus._M_p != &absFile.field_2) {
        operator_delete(absFile._M_dataplus._M_p,absFile.field_2._M_allocated_capacity + 1);
      }
    }
    if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
      absFile._M_dataplus._M_p = (pointer)&absFile.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&absFile,"FOLDER","");
      pcVar5 = cmTarget::GetProperty(target,&absFile);
      if (pcVar5 != (char *)0x0) {
        cmTarget::SetProperty(this_02,&absFile,pcVar5);
      }
    }
    else {
      absFile._M_dataplus._M_p = (pointer)&absFile.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&absFile,"FOLDER","");
      cmTarget::SetProperty(this_02,&absFile,pcVar5);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)absFile._M_dataplus._M_p != &absFile.field_2) {
      operator_delete(absFile._M_dataplus._M_p,absFile.field_2._M_allocated_capacity + 1);
    }
    cmTarget::AddUtility(target,&autogenTargetName,(cmMakefile *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&rcc_output);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)autogenComment._M_dataplus._M_p != &autogenComment.field_2) {
      operator_delete(autogenComment._M_dataplus._M_p,
                      autogenComment.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tools._M_dataplus._M_p != &tools.field_2) {
      operator_delete(tools._M_dataplus._M_p,tools.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&toolNames);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&depends);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)workingDirectory._M_dataplus._M_p != &workingDirectory.field_2) {
      operator_delete(workingDirectory._M_dataplus._M_p,
                      workingDirectory.field_2._M_allocated_capacity + 1);
    }
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
              (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&currentLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetDir._M_dataplus._M_p != &targetDir.field_2) {
      operator_delete(targetDir._M_dataplus._M_p,targetDir.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)autogenTargetName._M_dataplus._M_p != &autogenTargetName.field_2) {
      operator_delete(autogenTargetName._M_dataplus._M_p,
                      autogenTargetName.field_2._M_allocated_capacity + 1);
    }
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)qtMajorVersion._M_dataplus._M_p != &qtMajorVersion.field_2) {
    operator_delete(qtMajorVersion._M_dataplus._M_p,qtMajorVersion.field_2._M_allocated_capacity + 1
                   );
  }
  return bVar3;
}

Assistant:

bool cmQtAutoGenerators::InitializeAutogenTarget(cmTarget* target)
{
  cmMakefile* makefile = target->GetMakefile();
  // don't do anything if there is no Qt4 or Qt5Core (which contains moc):
  std::string qtMajorVersion = makefile->GetSafeDefinition("QT_VERSION_MAJOR");
  if (qtMajorVersion == "")
    {
    qtMajorVersion = makefile->GetSafeDefinition("Qt5Core_VERSION_MAJOR");
    }
  if (qtMajorVersion != "4" && qtMajorVersion != "5")
    {
    return false;
    }

  if (target->GetPropertyAsBool("AUTOMOC"))
    {
    std::string automocTargetName = getAutogenTargetName(target);
    std::string mocCppFile = makefile->GetCurrentBinaryDirectory();
    mocCppFile += "/";
    mocCppFile += automocTargetName;
    mocCppFile += ".cpp";
    makefile->GetOrCreateSource(mocCppFile, true);
    makefile->AppendProperty("ADDITIONAL_MAKE_CLEAN_FILES",
                            mocCppFile.c_str(), false);

    target->AddSource(mocCppFile);
    }
  // create a custom target for running generators at buildtime:
  std::string autogenTargetName = getAutogenTargetName(target);

  std::string targetDir = getAutogenTargetDir(target);

  cmCustomCommandLine currentLine;
  currentLine.push_back(cmSystemTools::GetCMakeCommand());
  currentLine.push_back("-E");
  currentLine.push_back("cmake_autogen");
  currentLine.push_back(targetDir);
  currentLine.push_back("$<CONFIGURATION>");

  cmCustomCommandLines commandLines;
  commandLines.push_back(currentLine);

  std::string workingDirectory = cmSystemTools::CollapseFullPath(
                                    "", makefile->GetCurrentBinaryDirectory());

  std::vector<std::string> depends;
  if (const char *autogenDepends =
                                target->GetProperty("AUTOGEN_TARGET_DEPENDS"))
    {
    cmSystemTools::ExpandListArgument(autogenDepends, depends);
    }
  std::vector<std::string> toolNames;
  if (target->GetPropertyAsBool("AUTOMOC"))
    {
    toolNames.push_back("moc");
    }
  if (target->GetPropertyAsBool("AUTOUIC"))
    {
    toolNames.push_back("uic");
    }
  if (target->GetPropertyAsBool("AUTORCC"))
    {
    toolNames.push_back("rcc");
    }

  std::string tools = toolNames[0];
  toolNames.erase(toolNames.begin());
  while (toolNames.size() > 1)
    {
    tools += ", " + toolNames[0];
    toolNames.erase(toolNames.begin());
    }
  if (toolNames.size() == 1)
    {
    tools += " and " + toolNames[0];
    }
  std::string autogenComment = "Automatic " + tools + " for target ";
  autogenComment += target->GetName();

#if defined(_WIN32) && !defined(__CYGWIN__)
  bool usePRE_BUILD = false;
  cmGlobalGenerator* gg = makefile->GetGlobalGenerator();
  if(gg->GetName().find("Visual Studio") != std::string::npos)
    {
    cmGlobalVisualStudioGenerator* vsgg =
      static_cast<cmGlobalVisualStudioGenerator*>(gg);
    // Under VS >= 7 use a PRE_BUILD event instead of a separate target to
    // reduce the number of targets loaded into the IDE.
    // This also works around a VS 11 bug that may skip updating the target:
    //  https://connect.microsoft.com/VisualStudio/feedback/details/769495
    usePRE_BUILD = vsgg->GetVersion() >= cmGlobalVisualStudioGenerator::VS7;
    if(usePRE_BUILD)
      {
      for (std::vector<std::string>::iterator it = depends.begin();
            it != depends.end(); ++it)
        {
        if(!makefile->FindTargetToUse(it->c_str()))
          {
          usePRE_BUILD = false;
          break;
          }
        }
      }
    }
#endif

  std::vector<std::string> rcc_output;
  bool const isNinja =
    makefile->GetGlobalGenerator()->GetName() == "Ninja";
  if(isNinja
#if defined(_WIN32) && !defined(__CYGWIN__)
        || usePRE_BUILD
#endif
        )
    {
    std::vector<cmSourceFile*> srcFiles;
    target->GetConfigCommonSourceFiles(srcFiles);
    for(std::vector<cmSourceFile*>::const_iterator fileIt = srcFiles.begin();
        fileIt != srcFiles.end();
        ++fileIt)
      {
      cmSourceFile* sf = *fileIt;
      std::string absFile = cmsys::SystemTools::GetRealPath(
                                                sf->GetFullPath());

      std::string ext = sf->GetExtension();

      if (target->GetPropertyAsBool("AUTORCC"))
        {
        if (ext == "qrc"
            && !cmSystemTools::IsOn(sf->GetPropertyForUser("SKIP_AUTORCC")))
          {
          std::string basename = cmsys::SystemTools::
                                  GetFilenameWithoutLastExtension(absFile);

          std::string rcc_output_dir = target->GetSupportDirectory();
          cmSystemTools::MakeDirectory(rcc_output_dir.c_str());
          std::string rcc_output_file = rcc_output_dir;
          rcc_output_file += "/qrc_" + basename + ".cpp";
          rcc_output.push_back(rcc_output_file);

          if (!cmSystemTools::IsOn(sf->GetPropertyForUser("GENERATED")))
            {
            if (qtMajorVersion == "5")
              {
              this->ListQt5RccInputs(sf, target, depends);
              }
            else
              {
              this->ListQt4RccInputs(sf, depends);
              }
#if defined(_WIN32) && !defined(__CYGWIN__)
            // Cannot use PRE_BUILD because the resource files themselves
            // may not be sources within the target so VS may not know the
            // target needs to re-build at all.
            usePRE_BUILD = false;
#endif
            }
          }
        }
      }
    }

#if defined(_WIN32) && !defined(__CYGWIN__)
  if(usePRE_BUILD)
    {
    // Add the pre-build command directly to bypass the OBJECT_LIBRARY
    // rejection in cmMakefile::AddCustomCommandToTarget because we know
    // PRE_BUILD will work for an OBJECT_LIBRARY in this specific case.
    std::vector<std::string> no_output;
    std::vector<std::string> no_byproducts;
    cmCustomCommand cc(makefile, no_output, no_byproducts, depends,
                       commandLines, autogenComment.c_str(),
                       workingDirectory.c_str());
    cc.SetEscapeOldStyle(false);
    cc.SetEscapeAllowMakeVars(true);
    target->AddPreBuildCommand(cc);
    }
  else
#endif
    {
    cmTarget* autogenTarget = makefile->AddUtilityCommand(
                                autogenTargetName, true,
                                workingDirectory.c_str(),
                                /*byproducts=*/rcc_output, depends,
                                commandLines, false, autogenComment.c_str());

    // Set target folder
    const char* autogenFolder = makefile->GetState()
                                ->GetGlobalProperty("AUTOMOC_TARGETS_FOLDER");
    if (!autogenFolder)
      {
      autogenFolder = makefile->GetState()
                                ->GetGlobalProperty("AUTOGEN_TARGETS_FOLDER");
      }
    if (autogenFolder && *autogenFolder)
      {
      autogenTarget->SetProperty("FOLDER", autogenFolder);
      }
    else
      {
      // inherit FOLDER property from target (#13688)
      copyTargetProperty(autogenTarget, target, "FOLDER");
      }

    target->AddUtility(autogenTargetName);
    }

  return true;
}